

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int luaH_next(lua_State *L,Table *t,StkId key)

{
  TValue *pTVar1;
  uint asize_00;
  Node *pNVar2;
  TValue *io2_1;
  TValue *io1_1;
  Node *n_;
  TValue *io_;
  Node *n;
  TValue *io2;
  TValue *io1;
  TValue *io;
  uint i;
  uint asize;
  StkId key_local;
  Table *t_local;
  lua_State *L_local;
  
  asize_00 = luaH_realasize(t);
  for (io._0_4_ = findindex(L,t,&key->val,asize_00); (uint)io < asize_00; io._0_4_ = (uint)io + 1) {
    if ((t->array[(uint)io].tt_ & 0xf) != 0) {
      *(ulong *)key = (ulong)((uint)io + 1);
      (key->val).tt_ = '\x03';
      pTVar1 = t->array;
      key[1].val.value_ = pTVar1[(uint)io].value_;
      *(lu_byte *)((long)key + 0x18) = pTVar1[(uint)io].tt_;
      return 1;
    }
  }
  io._0_4_ = (uint)io - asize_00;
  while( true ) {
    if (1 << (t->lsizenode & 0x1f) <= (int)(uint)io) {
      return 0;
    }
    if (((&t->node->u)[(uint)io].tt_ & 0xf) != 0) break;
    io._0_4_ = (uint)io + 1;
  }
  pNVar2 = t->node + (uint)io;
  (key->val).value_ = (pNVar2->u).key_val;
  (key->val).tt_ = (pNVar2->u).key_tt;
  key[1].val.value_ = (pNVar2->u).value_;
  *(lu_byte *)((long)key + 0x18) = (pNVar2->u).tt_;
  return 1;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = luaH_realasize(t);
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    if (!isempty(&t->array[i])) {  /* a non-empty entry? */
      setivalue(s2v(key), i + 1);
      setobj2s(L, key + 1, &t->array[i]);
      return 1;
    }
  }
  for (i -= asize; cast_int(i) < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}